

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O1

Matrix33 * AML::eulerAngles2DCM(Matrix33 *__return_storage_ptr__,EulerAngles *angles)

{
  switch(angles->seq_) {
  case ZXZ:
    eulerAngles2DCM_ZXZ(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    break;
  case XYX:
    eulerAngles2DCM_XYX(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    break;
  case YZY:
    eulerAngles2DCM_YZY(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    break;
  case ZYZ:
    eulerAngles2DCM_ZYZ(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    break;
  case XZX:
    eulerAngles2DCM_XZX(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    break;
  case YXY:
    eulerAngles2DCM_YXY(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    break;
  case XYZ:
    eulerAngles2DCM_XYZ(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    break;
  case YZX:
    eulerAngles2DCM_YZX(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    break;
  case ZXY:
    eulerAngles2DCM_ZXY(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    break;
  case XZY:
    eulerAngles2DCM_XZY(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    break;
  case ZYX:
    eulerAngles2DCM_ZYX(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    break;
  case YXZ:
    eulerAngles2DCM_YXZ(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
    break;
  default:
    Matrix33::identity();
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngles2DCM(const EulerAngles& angles)
    {
        switch (angles.getEulerSequence())
        {
        case EulerAngles::EulerSequence::XYZ:
            return eulerAngles2DCM_XYZ(angles.phi, angles.theta, angles.psi);
        case EulerAngles::EulerSequence::ZXZ:
            return eulerAngles2DCM_ZXZ(angles.phi, angles.theta, angles.psi);
        case EulerAngles::EulerSequence::XYX:
            return eulerAngles2DCM_XYX(angles.phi, angles.theta, angles.psi);
        case EulerAngles::EulerSequence::YZY:
            return eulerAngles2DCM_YZY(angles.phi, angles.theta, angles.psi);
        case EulerAngles::EulerSequence::ZYZ:
            return eulerAngles2DCM_ZYZ(angles.phi, angles.theta, angles.psi);
        case EulerAngles::EulerSequence::XZX:
            return eulerAngles2DCM_XZX(angles.phi, angles.theta, angles.psi);
        case EulerAngles::EulerSequence::YXY:
            return eulerAngles2DCM_YXY(angles.phi, angles.theta, angles.psi);
        case EulerAngles::EulerSequence::YZX:
            return eulerAngles2DCM_YZX(angles.phi, angles.theta, angles.psi);
        case EulerAngles::EulerSequence::ZXY:
            return eulerAngles2DCM_ZXY(angles.phi, angles.theta, angles.psi);
        case EulerAngles::EulerSequence::XZY:
            return eulerAngles2DCM_XZY(angles.phi, angles.theta, angles.psi);
        case EulerAngles::EulerSequence::ZYX:
            return eulerAngles2DCM_ZYX(angles.phi, angles.theta, angles.psi);
        case EulerAngles::EulerSequence::YXZ:
            return eulerAngles2DCM_YXZ(angles.phi, angles.theta, angles.psi);
        }
        return Matrix33::identity();
    }